

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::ArrayDimensionFunction::ArrayDimensionFunction
          (ArrayDimensionFunction *this,KnownSystemName knownNameId,bool unpackedOnly)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00688388;
  this->unpackedOnly = unpackedOnly;
  return;
}

Assistant:

ArrayDimensionFunction(KnownSystemName knownNameId, bool unpackedOnly) :
        SystemSubroutine(knownNameId, FUNC), unpackedOnly(unpackedOnly) {}